

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Shop::addNewSale(Shop *this)

{
  pointer pMVar1;
  long lVar2;
  int index;
  int quantity;
  int ignore;
  string date;
  string name;
  Medicine medicine;
  Sale s;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  string local_2a8;
  string local_288;
  undefined1 local_268 [8];
  _Alloc_hider local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  _Alloc_hider local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  Medicine local_220;
  Medicine local_190;
  Sale local_100;
  
  local_288._M_string_length = 0;
  local_288.field_2._M_local_buf[0] = '\0';
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Select the index of Medicine which you want to sell:",0x34);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  printMedicines(this);
  std::istream::operator>>((istream *)&std::cin,&local_2b4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Your selected Medicine is:",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  printMedicine(this,local_2b4 + -1);
  Medicine::Medicine(&local_190,
                     (this->medicineList).super__Vector_base<Medicine,_std::allocator<Medicine>_>.
                     _M_impl.super__Vector_impl_data._M_start + (long)local_2b4 + -1);
  local_190.isSold = true;
  local_190.quantity = local_190.quantity + -1;
  lVar2 = (long)local_2b4;
  pMVar1 = (this->medicineList).super__Vector_base<Medicine,_std::allocator<Medicine>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(ulong *)((long)&pMVar1[lVar2 + -1].unitePrice + 1) =
       CONCAT17(1,CONCAT43(local_190.quantity,local_190.unitePrice._1_3_));
  pMVar1[lVar2 + -1].id = local_190.id;
  pMVar1[lVar2 + -1].unitePrice =
       (int)(CONCAT35(local_190.unitePrice._1_3_,local_190._0_5_) >> 0x20);
  std::__cxx11::string::_M_assign((string *)&pMVar1[lVar2 + -1].name);
  std::__cxx11::string::_M_assign((string *)&pMVar1[lVar2 + -1].companyName);
  std::__cxx11::string::_M_assign((string *)&pMVar1[lVar2 + -1].arrivalDate);
  std::__cxx11::string::_M_assign((string *)&pMVar1[lVar2 + -1].expireDate);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter Customer Name:",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&local_288);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter Date:",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&local_2a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter Quantity:",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::istream::operator>>((istream *)&std::cin,&local_2b0);
  Sale::Sale(&local_100,
             (int)((ulong)((long)(this->salesList).super__Vector_base<Sale,_std::allocator<Sale>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->salesList).super__Vector_base<Sale,_std::allocator<Sale>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3) * 0x684bda13 + 1,
             local_2b0,&local_2a8,&local_288,&local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Your New Sell Summery is:",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  local_268._0_4_ = local_100.id;
  local_268._4_4_ = local_100.quantity;
  local_260._M_p = (pointer)&local_250;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,local_100.date._M_dataplus._M_p,
             local_100.date._M_dataplus._M_p + local_100.date._M_string_length);
  local_240._M_p = (pointer)&local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_240,local_100.customerName._M_dataplus._M_p,
             local_100.customerName._M_dataplus._M_p + local_100.customerName._M_string_length);
  Medicine::Medicine(&local_220,&local_100.medicine);
  printSale(this,(Sale *)local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.expireDate._M_dataplus._M_p != &local_220.expireDate.field_2) {
    operator_delete(local_220.expireDate._M_dataplus._M_p,
                    local_220.expireDate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.arrivalDate._M_dataplus._M_p != &local_220.arrivalDate.field_2) {
    operator_delete(local_220.arrivalDate._M_dataplus._M_p,
                    local_220.arrivalDate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.companyName._M_dataplus._M_p != &local_220.companyName.field_2) {
    operator_delete(local_220.companyName._M_dataplus._M_p,
                    local_220.companyName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.name._M_dataplus._M_p != &local_220.name.field_2) {
    operator_delete(local_220.name._M_dataplus._M_p,local_220.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_p != &local_230) {
    operator_delete(local_240._M_p,local_230._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_p != &local_250) {
    operator_delete(local_260._M_p,local_250._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Press any kew to Confirm:",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::istream::operator>>((istream *)&std::cin,&local_2ac);
  std::vector<Sale,_std::allocator<Sale>_>::push_back(&this->salesList,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.medicine.expireDate._M_dataplus._M_p != &local_100.medicine.expireDate.field_2) {
    operator_delete(local_100.medicine.expireDate._M_dataplus._M_p,
                    local_100.medicine.expireDate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.medicine.arrivalDate._M_dataplus._M_p != &local_100.medicine.arrivalDate.field_2)
  {
    operator_delete(local_100.medicine.arrivalDate._M_dataplus._M_p,
                    local_100.medicine.arrivalDate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.medicine.companyName._M_dataplus._M_p != &local_100.medicine.companyName.field_2)
  {
    operator_delete(local_100.medicine.companyName._M_dataplus._M_p,
                    local_100.medicine.companyName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.medicine.name._M_dataplus._M_p != &local_100.medicine.name.field_2) {
    operator_delete(local_100.medicine.name._M_dataplus._M_p,
                    local_100.medicine.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.customerName._M_dataplus._M_p != &local_100.customerName.field_2) {
    operator_delete(local_100.customerName._M_dataplus._M_p,
                    local_100.customerName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.date._M_dataplus._M_p != &local_100.date.field_2) {
    operator_delete(local_100.date._M_dataplus._M_p,local_100.date.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.expireDate._M_dataplus._M_p != &local_190.expireDate.field_2) {
    operator_delete(local_190.expireDate._M_dataplus._M_p,
                    local_190.expireDate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.arrivalDate._M_dataplus._M_p != &local_190.arrivalDate.field_2) {
    operator_delete(local_190.arrivalDate._M_dataplus._M_p,
                    local_190.arrivalDate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.companyName._M_dataplus._M_p != &local_190.companyName.field_2) {
    operator_delete(local_190.companyName._M_dataplus._M_p,
                    local_190.companyName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.name._M_dataplus._M_p != &local_190.name.field_2) {
    operator_delete(local_190.name._M_dataplus._M_p,local_190.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,
                    CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                             local_2a8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,
                    CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                             local_288.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void addNewSale() {
        int index, ignore;
        int quantity;
        string name, date;

        cout << "Select the index of Medicine which you want to sell:" << endl;
        printMedicines();
        cin >> index;
        cout << "Your selected Medicine is:" << endl;
        printMedicine(index - 1);

        Medicine medicine = medicineList[index - 1];
        medicine.isSold = true;
        medicine.quantity--;
        medicineList[index - 1] = medicine;

        cout << "Enter Customer Name:" << endl;
        cin >> name;
        cout << "Enter Date:" << endl;
        cin >> date;
        cout << "Enter Quantity:" << endl;
        cin >> quantity;
        Sale s = Sale(salesList.size() + 1, quantity, date, name, medicine);

        cout << "Your New Sell Summery is:" << endl;
        printSale(s);

        cout << "Press any kew to Confirm:" << endl;
        cin >> ignore;
        salesList.push_back(s);

    }